

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O2

REF_STATUS
ref_iso_boomray(char *filename,REF_GRID ref_grid,REF_DBL *field,REF_INT ldim,char **scalar_names,
               REF_DBL *segment0,REF_DBL *segment1)

{
  REF_MPI pRVar1;
  REF_NODE pRVar2;
  REF_INT n_00;
  uint uVar3;
  int iVar4;
  FILE *pFVar5;
  long lVar6;
  void *my_array;
  ulong uVar7;
  REF_DBL *pRVar8;
  REF_INT *sorted_index;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  REF_DBL *pRVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  REF_INT ldim_00;
  ulong uVar19;
  uint uVar20;
  REF_INT n;
  FILE *local_a0;
  REF_DBL *xyzf;
  ulong local_90;
  REF_GRID ray_grid;
  REF_MPI local_80;
  REF_INT *source;
  REF_DBL *ray_field;
  REF_DBL ds [3];
  REF_DBL dt [3];
  
  pRVar1 = ref_grid->mpi;
  pFVar5 = fopen(filename,"w");
  if (pFVar5 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar17 = "unable to open file";
    uVar10 = 0x37d;
    goto LAB_00169ef7;
  }
  local_80 = pRVar1;
  fwrite("title=\"tecplot refine gather\"\n",0x1e,1,pFVar5);
  local_a0 = pFVar5;
  fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,pFVar5);
  pFVar5 = local_a0;
  uVar3 = 0;
  if (0 < ldim) {
    uVar3 = ldim;
  }
  local_90 = (ulong)(uint)ldim;
  if (scalar_names == (char **)0x0) {
    for (uVar20 = 1; uVar20 - uVar3 != 1; uVar20 = uVar20 + 1) {
      fprintf(pFVar5," \"V%d\"",(ulong)uVar20);
    }
  }
  else {
    for (uVar19 = 0; uVar3 != uVar19; uVar19 = uVar19 + 1) {
      fprintf(pFVar5," \"%s\"",scalar_names[uVar19]);
    }
  }
  fputc(10,pFVar5);
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    ds[lVar6] = segment1[lVar6] - segment0[lVar6];
  }
  uVar3 = ref_math_normalize(ds);
  if (uVar3 == 0) {
    iVar13 = (int)local_90;
    uVar3 = ref_iso_cast(&ray_grid,&ray_field,ref_grid,field,iVar13,segment0,segment1);
    if (uVar3 == 0) {
      pRVar2 = ray_grid->node;
      uVar9 = 0;
      uVar19 = (ulong)(uint)pRVar2->max;
      if (pRVar2->max < 1) {
        uVar19 = uVar9;
      }
      iVar4 = 0;
      for (; uVar19 != uVar9; uVar9 = uVar9 + 1) {
        if (-1 < pRVar2->global[uVar9]) {
          iVar4 = iVar4 + (uint)(pRVar2->ref_mpi->id == pRVar2->part[uVar9]);
        }
      }
      lVar6 = (long)iVar13 + 3;
      ldim_00 = (REF_INT)lVar6;
      if (iVar4 * ldim_00 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x393
               ,"ref_iso_boomray","malloc local_xyzf of REF_DBL negative");
        return 1;
      }
      my_array = malloc((ulong)(uint)(iVar4 * ldim_00) << 3);
      if (my_array == (void *)0x0) {
        pcVar17 = "malloc local_xyzf of REF_DBL NULL";
        uVar10 = 0x393;
      }
      else {
        uVar7 = 0;
        uVar9 = local_90 & 0xffffffff;
        if ((int)local_90 < 1) {
          uVar9 = uVar7;
        }
        iVar4 = 0;
        pRVar8 = ray_field;
        for (uVar11 = 0; uVar11 != uVar19; uVar11 = uVar11 + 1) {
          if ((-1 < pRVar2->global[uVar11]) && (pRVar2->ref_mpi->id == pRVar2->part[uVar11])) {
            pRVar15 = pRVar2->real;
            for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
              *(undefined8 *)((long)my_array + lVar18 * 8 + (long)(iVar4 * ldim_00) * 8) =
                   *(undefined8 *)((long)pRVar15 + lVar18 * 8 + uVar7);
            }
            for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
              *(REF_DBL *)((long)my_array + (long)(iVar4 * ldim_00 + 3 + (int)uVar16) * 8) =
                   pRVar8[uVar16];
            }
            iVar4 = iVar4 + 1;
          }
          uVar7 = uVar7 + 0x78;
          pRVar8 = pRVar8 + iVar13;
        }
        free(ray_field);
        ref_grid_free(ray_grid);
        pRVar1 = local_80;
        uVar3 = ref_mpi_allconcat(local_80,ldim_00,iVar4,my_array,&n,&source,&xyzf,3);
        if (uVar3 != 0) {
          uVar19 = (ulong)uVar3;
          pcVar17 = "concat";
          uVar10 = 0x3a3;
          goto LAB_00169ff6;
        }
        free(my_array);
        if (pRVar1->id != 0) {
          return 0;
        }
        free(source);
        n_00 = n;
        lVar18 = (long)n;
        if (lVar18 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x3a7,"ref_iso_boomray","malloc t of REF_DBL negative");
          return 1;
        }
        pRVar8 = (REF_DBL *)malloc(lVar18 * 8);
        pFVar5 = local_a0;
        if (pRVar8 == (REF_DBL *)0x0) {
          pcVar17 = "malloc t of REF_DBL NULL";
          uVar10 = 0x3a7;
        }
        else {
          pRVar15 = xyzf;
          for (lVar12 = 0; lVar12 != lVar18; lVar12 = lVar12 + 1) {
            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
              dt[lVar14] = pRVar15[lVar14] - segment0[lVar14];
            }
            pRVar8[lVar12] = dt[2] * ds[2] + dt[0] * ds[0] + dt[1] * ds[1];
            pRVar15 = pRVar15 + ldim_00;
          }
          sorted_index = (REF_INT *)malloc(lVar18 * 4);
          if (sorted_index != (REF_INT *)0x0) {
            uVar3 = ref_sort_heap_dbl(n_00,pRVar8,sorted_index);
            if (uVar3 == 0) {
              fprintf(pFVar5," zone t=\"((%.2f,%.2f,%.2f),(%.2f,%.2f,%.2f))\"\n",*segment0,
                      segment0[1],segment0[2],*segment1,segment1[1],segment1[2]);
              lVar18 = 0;
              iVar13 = 0;
              if (0 < ldim_00) {
                iVar13 = ldim_00;
              }
              for (; lVar18 < n; lVar18 = lVar18 + 1) {
                for (lVar12 = 0; iVar13 != (int)lVar12; lVar12 = lVar12 + 1) {
                  fprintf(pFVar5," %.15e",xyzf[sorted_index[lVar18] * lVar6 + lVar12]);
                }
                fputc(10,pFVar5);
              }
              free(sorted_index);
              free(pRVar8);
              free(xyzf);
              return 0;
            }
            uVar19 = (ulong)uVar3;
            pcVar17 = "sort t";
            uVar10 = 0x3ae;
            goto LAB_00169ff6;
          }
          pcVar17 = "malloc order of REF_INT NULL";
          uVar10 = 0x3ad;
        }
      }
LAB_00169ef7:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar10,
             "ref_iso_boomray",pcVar17);
      return 2;
    }
    uVar19 = (ulong)uVar3;
    pcVar17 = "cast";
    uVar10 = 0x38b;
  }
  else {
    uVar19 = (ulong)uVar3;
    pcVar17 = "segment unit vector";
    uVar10 = 0x387;
  }
LAB_00169ff6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar10,
         "ref_iso_boomray",uVar19,pcVar17);
  return (REF_STATUS)uVar19;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boomray(const char *filename, REF_GRID ref_grid,
                                   REF_DBL *field, REF_INT ldim,
                                   const char **scalar_names, REF_DBL *segment0,
                                   REF_DBL *segment1) {
  FILE *file;
  REF_DBL ds[3], dt[3];
  REF_GRID ray_grid;
  REF_DBL *ray_field;
  REF_DBL *local_xyzf, *xyzf, *t;
  REF_NODE ref_node;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node, local_n, n, *source, i, *order;
  file = fopen(filename, "w");
  if (NULL == file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");
  fprintf(file, "title=\"tecplot refine gather\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"");
  if (NULL != scalar_names) {
    for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
  } else {
    for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
  }
  fprintf(file, "\n");
  for (i = 0; i < 3; i++) ds[i] = segment1[i] - segment0[i];
  RSS(ref_math_normalize(ds), "segment unit vector");

  RSS(ref_iso_cast(&ray_grid, &ray_field, ref_grid, field, ldim, segment0,
                   segment1),
      "cast");
  ref_node = ref_grid_node(ray_grid);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      local_n++;
    }
  }
  ref_malloc(local_xyzf, local_n * (3 + ldim), REF_DBL);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++)
        local_xyzf[i + (3 + ldim) * local_n] = ref_node_xyz(ref_node, i, node);
      for (i = 0; i < ldim; i++)
        local_xyzf[3 + i + (3 + ldim) * local_n] = ray_field[i + node * ldim];
      local_n++;
    }
  }
  ref_free(ray_field);
  ref_grid_free(ray_grid);

  RSS(ref_mpi_allconcat(ref_mpi, 3 + ldim, local_n, local_xyzf, &n, &source,
                        (void **)(&xyzf), REF_DBL_TYPE),
      "concat");
  ref_free(local_xyzf);
  if (ref_mpi_once(ref_mpi)) {
    ref_free(source);
    ref_malloc(t, n, REF_DBL);

    for (node = 0; node < n; node++) {
      for (i = 0; i < 3; i++) dt[i] = xyzf[i + (3 + ldim) * node] - segment0[i];
      t[node] = ref_math_dot(dt, ds);
    }
    ref_malloc(order, n, REF_INT);
    RSS(ref_sort_heap_dbl(n, t, order), "sort t");
    fprintf(file, " zone t=\"((%.2f,%.2f,%.2f),(%.2f,%.2f,%.2f))\"\n",
            segment0[0], segment0[1], segment0[2], segment1[0], segment1[1],
            segment1[2]);
    for (node = 0; node < n; node++) {
      for (i = 0; i < 3 + ldim; i++) {
        fprintf(file, " %.15e", xyzf[i + (3 + ldim) * order[node]]);
      }
      fprintf(file, "\n");
    }
    ref_free(order);
    ref_free(t);
    ref_free(xyzf);
  }
  return REF_SUCCESS;
}